

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O0

GLPipelineObj * __thiscall
Diligent::PipelineStateGLImpl::GetGLProgramPipeline
          (PipelineStateGLImpl *this,NativeGLContextType Context)

{
  PFNGLUSEPROGRAMSTAGESPROC p_Var1;
  bool bVar2;
  GLuint GVar3;
  Uint32 UVar4;
  SHADER_TYPE ShaderType;
  GLenum GVar5;
  GLuint GVar6;
  reference pvVar7;
  element_type *this_00;
  GLProgramObj *this_01;
  Char *Message;
  undefined1 local_98 [8];
  string msg;
  GLenum err;
  GLenum GLShaderBit;
  Uint32 i;
  GLuint Pipeline;
  value_type *ctx_pipeline;
  bool local_4d [5];
  reference local_48;
  pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>
  *ctx_pipeline_1;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
  *__range1;
  SpinLockGuard Guard;
  NativeGLContextType Context_local;
  PipelineStateGLImpl *this_local;
  
  Guard._M_device = (mutex_type *)Context;
  std::lock_guard<Threading::SpinLock>::lock_guard
            ((lock_guard<Threading::SpinLock> *)&__range1,&this->m_ProgPipelineLock);
  __end1 = std::
           vector<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
           ::begin(&this->m_GLProgPipelines);
  ctx_pipeline_1 =
       (pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>
        *)std::
          vector<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
          ::end(&this->m_GLProgPipelines);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_*,_std::vector<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>_>
                                     *)&ctx_pipeline_1), bVar2) {
    local_48 = __gnu_cxx::
               __normal_iterator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_*,_std::vector<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>_>
               ::operator*(&__end1);
    pvVar7 = local_48;
    if (local_48->first == (__GLXcontextRec *)Guard._M_device) goto LAB_0043d2fd;
    __gnu_cxx::
    __normal_iterator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_*,_std::vector<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>_>
    ::operator++(&__end1);
  }
  local_4d[0] = true;
  std::
  vector<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>,std::allocator<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>>>
  ::emplace_back<__GLXcontextRec*&,bool>
            ((vector<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>,std::allocator<std::pair<__GLXcontextRec*,GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>>>>
              *)&this->m_GLProgPipelines,(__GLXcontextRec **)&Guard,local_4d);
  pvVar7 = std::
           vector<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
           ::back(&this->m_GLProgPipelines);
  GVar3 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                    ((GLObjWrapper *)&pvVar7->second);
  for (err = 0; UVar4 = GetNumShaderStages(this), err < UVar4; err = err + 1) {
    ShaderType = GetShaderStageType(this,err);
    GVar5 = ShaderTypeToGLShaderBit(ShaderType);
    p_Var1 = __glewUseProgramStages;
    msg.field_2._12_4_ = GVar5;
    this_00 = std::
              __shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)(this->m_GLPrograms + err));
    this_01 = GLProgram::GetGLHandle(this_00);
    GVar6 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)this_01);
    (*p_Var1)(GVar3,GVar5,GVar6);
    msg.field_2._8_4_ = glGetError();
    if (msg.field_2._8_4_ != 0) {
      LogError<false,char[28],char[17],unsigned_int>
                (false,"GetGLProgramPipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                 ,0x287,(char (*) [28])"glUseProgramStages() failed",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_98,(char (*) [6])0xe8e72e);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"GetGLProgramPipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                 ,0x287);
      std::__cxx11::string::~string((string *)local_98);
    }
  }
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>::SetName
            (&pvVar7->second,
             (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
LAB_0043d2fd:
  this_local = (PipelineStateGLImpl *)&pvVar7->second;
  local_4d[1] = true;
  local_4d[2] = false;
  local_4d[3] = false;
  local_4d[4] = false;
  std::lock_guard<Threading::SpinLock>::~lock_guard((lock_guard<Threading::SpinLock> *)&__range1);
  return (GLPipelineObj *)this_local;
}

Assistant:

GLObjectWrappers::GLPipelineObj& PipelineStateGLImpl::GetGLProgramPipeline(GLContext::NativeGLContextType Context)
{
    Threading::SpinLockGuard Guard{m_ProgPipelineLock};
    for (auto& ctx_pipeline : m_GLProgPipelines)
    {
        if (ctx_pipeline.first == Context)
            return ctx_pipeline.second;
    }

    // Create new program pipeline
    m_GLProgPipelines.emplace_back(Context, true);
    auto&  ctx_pipeline = m_GLProgPipelines.back();
    GLuint Pipeline     = ctx_pipeline.second;
    for (Uint32 i = 0; i < GetNumShaderStages(); ++i)
    {
        auto GLShaderBit = ShaderTypeToGLShaderBit(GetShaderStageType(i));
        // If the program has an active code for each stage mentioned in set flags,
        // then that code will be used by the pipeline. If program is 0, then the given
        // stages are cleared from the pipeline.
        glUseProgramStages(Pipeline, GLShaderBit, m_GLPrograms[i]->GetGLHandle());
        DEV_CHECK_GL_ERROR("glUseProgramStages() failed");
    }

    ctx_pipeline.second.SetName(m_Desc.Name);

    return ctx_pipeline.second;
}